

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signed.cpp
# Opt level: O0

sc_signed * sc_dt::operator/(sc_unsigned *u,sc_signed *v)

{
  small_type vnb;
  sc_digit *in_RDX;
  long in_RSI;
  sc_signed *in_RDI;
  int in_stack_00000010;
  sc_digit *in_stack_00000018;
  small_type s;
  sc_length_param *in_stack_ffffffffffffffc0;
  sc_length_param in_stack_ffffffffffffffe0;
  sc_signed *psVar1;
  
  psVar1 = in_RDI;
  vnb = mul_signs(*(small_type *)(in_RSI + 8),in_RDX[2]);
  if (vnb == 0) {
    div_by_zero<int>(0);
    sc_length_param::sc_length_param(in_stack_ffffffffffffffc0);
    sc_length_param::len((sc_length_param *)&stack0xffffffffffffffe0);
    sc_signed::sc_signed
              ((sc_signed *)CONCAT44(vnb,in_stack_ffffffffffffffe0.m_len),
               (int)((ulong)in_RDI >> 0x20));
  }
  else {
    div_signed_friend((small_type)((ulong)psVar1 >> 0x20),(int)psVar1,(int)((ulong)in_RSI >> 0x20),
                      in_RDX,vnb,in_stack_00000010,in_stack_00000018);
  }
  return in_RDI;
}

Assistant:

sc_signed
operator/(const sc_unsigned& u, const sc_signed& v)
{

  small_type s = mul_signs(u.sgn, v.sgn);

  if (s == SC_ZERO) {
    div_by_zero(v.sgn); // case 1
    return sc_signed();  // case 2
  }

  // other cases
  return div_signed_friend(s, u.nbits, u.ndigits, u.digit,
                           v.nbits, v.ndigits, v.digit);

}